

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FenceBase.hpp
# Opt level: O2

void __thiscall
Diligent::FenceBase<Diligent::EngineGLImplTraits>::DvpSignal
          (FenceBase<Diligent::EngineGLImplTraits> *this,Uint64 NewValue)

{
  ulong uVar1;
  Uint64 UVar2;
  bool bVar3;
  char (*in_stack_ffffffffffffffb8) [71];
  Uint64 EnqueuedValue;
  Uint64 NewValue_local;
  string msg;
  
  EnqueuedValue = (this->m_EnqueuedFenceValue).super___atomic_base<unsigned_long>._M_i;
  NewValue_local = NewValue;
  if (NewValue < EnqueuedValue) {
    FormatString<char[8],char_const*,char[55],unsigned_long,char[27],unsigned_long,char[71]>
              (&msg,(Diligent *)0x70a495,
               (char (*) [8])
               &(this->
                super_DeviceObjectBase<Diligent::IFenceGL,_Diligent::RenderDeviceGLImpl,_Diligent::FenceDesc>
                ).m_Desc,(char **)"\' is being signaled or enqueued for signal with value ",
               (char (*) [55])&NewValue_local,(unsigned_long *)", but the previous value (",
               (char (*) [27])&EnqueuedValue,
               (unsigned_long *)
               ") is greater than the new value. Signal operation will have no effect.",
               in_stack_ffffffffffffffb8);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"DvpSignal",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/FenceBase.hpp"
               ,0x51);
    std::__cxx11::string::~string((string *)&msg);
  }
  do {
    UVar2 = NewValue_local;
    if (NewValue_local < EnqueuedValue) {
      UVar2 = EnqueuedValue;
    }
    LOCK();
    uVar1 = (this->m_EnqueuedFenceValue).super___atomic_base<unsigned_long>._M_i;
    bVar3 = EnqueuedValue == uVar1;
    if (bVar3) {
      (this->m_EnqueuedFenceValue).super___atomic_base<unsigned_long>._M_i = UVar2;
      uVar1 = EnqueuedValue;
    }
    UNLOCK();
    EnqueuedValue = uVar1;
  } while (!bVar3);
  return;
}

Assistant:

void DvpSignal(Uint64 NewValue)
    {
#ifdef DILIGENT_DEVELOPMENT
        Uint64 EnqueuedValue = m_EnqueuedFenceValue.load();
        DEV_CHECK_ERR(NewValue >= EnqueuedValue,
                      "Fence '", this->m_Desc.Name, "' is being signaled or enqueued for signal with value ", NewValue,
                      ", but the previous value (", EnqueuedValue,
                      ") is greater than the new value. Signal operation will have no effect.");

        while (!m_EnqueuedFenceValue.compare_exchange_weak(EnqueuedValue, std::max(EnqueuedValue, NewValue)))
        {
            // If exchange fails, EnqueuedValue will hold the actual value of m_EnqueuedFenceValue.
        }
#endif
    }